

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_emptyImportWithAndWithoutId_Test::TestBody(Parser_emptyImportWithAndWithoutId_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  shared_ptr<libcellml::Logger> local_138;
  ScopedTrace local_121;
  undefined1 local_120 [7];
  ScopedTrace gtest_trace_1237;
  ModelPtr m;
  ParserPtr parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Parser_emptyImportWithAndWithoutId_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n  <import/>  <import id = \"import_id\" />\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
       1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"Import does not specify an xlink:href attribute.",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"Import from \'\' is empty and will be disregarded.",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"Import does not specify an xlink:href attribute.",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,
             "Import from \'\' has an identifier of \'import_id\' but is empty. The import will be disregarded and the associated identifier will be lost."
             ,(allocator<char> *)
              ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4));
  parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
       0;
  local_70 = &local_f0;
  local_68 = 4;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 2);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 2));
  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70;
  do {
    local_190 = local_190 + -1;
    std::__cxx11::string::~string((string *)local_190);
  } while (local_190 != &local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  this_01 = &m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_01,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_01);
  libcellml::Parser::parseModel((string *)local_120);
  testing::ScopedTrace::ScopedTrace
            (&local_121,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
             ,0x4d5,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Parser,void>
            (&local_138,
             (shared_ptr<libcellml::Parser> *)
             &m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expectEqualIssues((vector *)local_60,(shared_ptr *)&local_138);
  std::shared_ptr<libcellml::Logger>::~shared_ptr(&local_138);
  testing::ScopedTrace::~ScopedTrace(&local_121);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_120);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Parser, emptyImportWithAndWithoutId)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <import/>"
        "  <import id = \"import_id\" />\n"
        "</model>\n";
    std::vector<std::string> e = {
        "Import does not specify an xlink:href attribute.",
        "Import from '' is empty and will be disregarded.",
        "Import does not specify an xlink:href attribute.",
        "Import from '' has an identifier of 'import_id' but is empty. The import will be disregarded and the associated identifier will be lost.",
    };
    libcellml::ParserPtr parser = libcellml::Parser::create();
    auto m = parser->parseModel(in);
    EXPECT_EQ_ISSUES(e, parser);
}